

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecryptPDF.cpp
# Opt level: O3

int RecryptPDF(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  EStatusCode EVar5;
  LogConfiguration *pLVar6;
  EncryptionOptions *pEVar7;
  long lVar8;
  char *pcVar9;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  PDFCreationSettings local_220;
  undefined1 local_1c0 [8];
  _Alloc_hider local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  longlong local_198;
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  undefined1 local_170 [8];
  _Alloc_hider local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  longlong local_148;
  _Alloc_hider local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  EncryptionOptions local_120;
  EncryptionOptions local_d0;
  EncryptionOptions local_80;
  
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"china.pdf","");
  BuildRelativeInputPath(&local_280,(char **)argv[1],&local_2a0);
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"");
  local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_300,"chinaWithoutEncryption.pdf","");
  BuildRelativeOutputPath(&local_2e0,(char **)argv[2],&local_300);
  pLVar6 = LogConfiguration::DefaultLogConfiguration();
  pEVar7 = EncryptionOptions::DefaultEncryptionOptions();
  local_170[0] = pEVar7->ShouldEncrypt;
  pcVar4 = (pEVar7->UserPassword)._M_dataplus._M_p;
  local_168._M_p = (pointer)&local_158;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_168,pcVar4,pcVar4 + (pEVar7->UserPassword)._M_string_length);
  local_148 = pEVar7->UserProtectionOptionsFlag;
  pcVar4 = (pEVar7->OwnerPassword)._M_dataplus._M_p;
  local_140._M_p = (pointer)&local_130;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_140,pcVar4,pcVar4 + (pEVar7->OwnerPassword)._M_string_length);
  PDFCreationSettings::PDFCreationSettings
            (&local_220,true,true,(EncryptionOptions *)local_170,false);
  EVar5 = PDFWriter::RecryptPDF
                    (&local_280,&local_2c0,&local_2e0,pLVar6,&local_220,ePDFVersionUndefined);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.DocumentEncryptionOptions.OwnerPassword._M_dataplus._M_p !=
      &local_220.DocumentEncryptionOptions.OwnerPassword.field_2) {
    operator_delete(local_220.DocumentEncryptionOptions.OwnerPassword._M_dataplus._M_p,
                    local_220.DocumentEncryptionOptions.OwnerPassword.field_2._M_allocated_capacity
                    + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.DocumentEncryptionOptions.UserPassword._M_dataplus._M_p !=
      &local_220.DocumentEncryptionOptions.UserPassword.field_2) {
    operator_delete(local_220.DocumentEncryptionOptions.UserPassword._M_dataplus._M_p,
                    local_220.DocumentEncryptionOptions.UserPassword.field_2._M_allocated_capacity +
                    1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_p != &local_130) {
    operator_delete(local_140._M_p,local_130._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_p != &local_158) {
    operator_delete(local_168._M_p,local_158._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  if (EVar5 == eSuccess) {
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"PDFWithPassword.pdf","");
    BuildRelativeInputPath(&local_280,(char **)argv[1],&local_2a0);
    local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"user","");
    local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_300,"RecryptPDFWithPasswordToNothing.pdf","");
    BuildRelativeOutputPath(&local_2e0,(char **)argv[2],&local_300);
    pLVar6 = LogConfiguration::DefaultLogConfiguration();
    pEVar7 = EncryptionOptions::DefaultEncryptionOptions();
    local_1c0[0] = pEVar7->ShouldEncrypt;
    pcVar4 = (pEVar7->UserPassword)._M_dataplus._M_p;
    local_1b8._M_p = (pointer)&local_1a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b8,pcVar4,pcVar4 + (pEVar7->UserPassword)._M_string_length);
    local_198 = pEVar7->UserProtectionOptionsFlag;
    pcVar4 = (pEVar7->OwnerPassword)._M_dataplus._M_p;
    local_190._M_p = (pointer)&local_180;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_190,pcVar4,pcVar4 + (pEVar7->OwnerPassword)._M_string_length);
    PDFCreationSettings::PDFCreationSettings
              (&local_220,true,true,(EncryptionOptions *)local_1c0,false);
    EVar5 = PDFWriter::RecryptPDF
                      (&local_280,&local_2c0,&local_2e0,pLVar6,&local_220,ePDFVersionUndefined);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220.DocumentEncryptionOptions.OwnerPassword._M_dataplus._M_p !=
        &local_220.DocumentEncryptionOptions.OwnerPassword.field_2) {
      operator_delete(local_220.DocumentEncryptionOptions.OwnerPassword._M_dataplus._M_p,
                      local_220.DocumentEncryptionOptions.OwnerPassword.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220.DocumentEncryptionOptions.UserPassword._M_dataplus._M_p !=
        &local_220.DocumentEncryptionOptions.UserPassword.field_2) {
      operator_delete(local_220.DocumentEncryptionOptions.UserPassword._M_dataplus._M_p,
                      local_220.DocumentEncryptionOptions.UserPassword.field_2._M_allocated_capacity
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_p != &local_180) {
      operator_delete(local_190._M_p,local_180._M_allocated_capacity + 1);
    }
    paVar1 = &local_2c0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_p != &local_1a8) {
      operator_delete(local_1b8._M_p,local_1a8._M_allocated_capacity + 1);
    }
    paVar2 = &local_2a0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != paVar2) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    if (EVar5 == eSuccess) {
      local_2a0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"PDFWithPassword.pdf","")
      ;
      BuildRelativeInputPath(&local_280,(char **)argv[1],&local_2a0);
      local_2c0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"user","");
      local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_300,"RecryptPDFWithPasswordToNewPassword.pdf","");
      BuildRelativeOutputPath(&local_2e0,(char **)argv[2],&local_300);
      pLVar6 = LogConfiguration::DefaultLogConfiguration();
      local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"user1","");
      paVar3 = &local_240.field_2;
      local_240._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"owner1","");
      EncryptionOptions::EncryptionOptions(&local_d0,&local_260,4,&local_240);
      PDFCreationSettings::PDFCreationSettings(&local_220,true,true,&local_d0,false);
      EVar5 = PDFWriter::RecryptPDF
                        (&local_280,&local_2c0,&local_2e0,pLVar6,&local_220,ePDFVersionUndefined);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220.DocumentEncryptionOptions.OwnerPassword._M_dataplus._M_p !=
          &local_220.DocumentEncryptionOptions.OwnerPassword.field_2) {
        operator_delete(local_220.DocumentEncryptionOptions.OwnerPassword._M_dataplus._M_p,
                        local_220.DocumentEncryptionOptions.OwnerPassword.field_2.
                        _M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220.DocumentEncryptionOptions.UserPassword._M_dataplus._M_p !=
          &local_220.DocumentEncryptionOptions.UserPassword.field_2) {
        operator_delete(local_220.DocumentEncryptionOptions.UserPassword._M_dataplus._M_p,
                        local_220.DocumentEncryptionOptions.UserPassword.field_2.
                        _M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0.OwnerPassword._M_dataplus._M_p != &local_d0.OwnerPassword.field_2) {
        operator_delete(local_d0.OwnerPassword._M_dataplus._M_p,
                        local_d0.OwnerPassword.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0.UserPassword._M_dataplus._M_p != &local_d0.UserPassword.field_2) {
        operator_delete(local_d0.UserPassword._M_dataplus._M_p,
                        local_d0.UserPassword.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != paVar3) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
        operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
        operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != paVar2) {
        operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
      }
      if (EVar5 == eSuccess) {
        local_2a0._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"Original.pdf","");
        BuildRelativeInputPath(&local_280,(char **)argv[1],&local_2a0);
        local_2c0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"");
        local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_300,"RecryptPDFOriginalToPasswordProtected.pdf","");
        BuildRelativeOutputPath(&local_2e0,(char **)argv[2],&local_300);
        pLVar6 = LogConfiguration::DefaultLogConfiguration();
        local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"user1","");
        local_240._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"owner1","");
        EncryptionOptions::EncryptionOptions(&local_120,&local_260,4,&local_240);
        PDFCreationSettings::PDFCreationSettings(&local_220,true,true,&local_120,false);
        EVar5 = PDFWriter::RecryptPDF
                          (&local_280,&local_2c0,&local_2e0,pLVar6,&local_220,ePDFVersionUndefined);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220.DocumentEncryptionOptions.OwnerPassword._M_dataplus._M_p !=
            &local_220.DocumentEncryptionOptions.OwnerPassword.field_2) {
          operator_delete(local_220.DocumentEncryptionOptions.OwnerPassword._M_dataplus._M_p,
                          local_220.DocumentEncryptionOptions.OwnerPassword.field_2.
                          _M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220.DocumentEncryptionOptions.UserPassword._M_dataplus._M_p !=
            &local_220.DocumentEncryptionOptions.UserPassword.field_2) {
          operator_delete(local_220.DocumentEncryptionOptions.UserPassword._M_dataplus._M_p,
                          local_220.DocumentEncryptionOptions.UserPassword.field_2.
                          _M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120.OwnerPassword._M_dataplus._M_p != &local_120.OwnerPassword.field_2) {
          operator_delete(local_120.OwnerPassword._M_dataplus._M_p,
                          local_120.OwnerPassword.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120.UserPassword._M_dataplus._M_p != &local_120.UserPassword.field_2) {
          operator_delete(local_120.UserPassword._M_dataplus._M_p,
                          local_120.UserPassword.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != paVar3) {
          operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) {
          operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_300._M_dataplus._M_p != &local_300.field_2) {
          operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_dataplus._M_p != paVar1) {
          operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != &local_280.field_2) {
          operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_dataplus._M_p != paVar2) {
          operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
        }
        if (EVar5 == eSuccess) {
          local_2a0._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"Original.pdf","");
          BuildRelativeInputPath(&local_280,(char **)argv[1],&local_2a0);
          local_2c0._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"");
          local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_300,"RecryptPDFOriginalToPasswordProtectedAES.pdf","");
          BuildRelativeOutputPath(&local_2e0,(char **)argv[2],&local_300);
          pLVar6 = LogConfiguration::DefaultLogConfiguration();
          local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"user1","");
          local_240._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"owner1","");
          EncryptionOptions::EncryptionOptions(&local_80,&local_260,4,&local_240);
          PDFCreationSettings::PDFCreationSettings(&local_220,true,true,&local_80,false);
          EVar5 = PDFWriter::RecryptPDF
                            (&local_280,&local_2c0,&local_2e0,pLVar6,&local_220,ePDFVersion16);
          PDFCreationSettings::~PDFCreationSettings(&local_220);
          EncryptionOptions::~EncryptionOptions(&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_240._M_dataplus._M_p != paVar3) {
            operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_dataplus._M_p != &local_260.field_2) {
            operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
            operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_300._M_dataplus._M_p != &local_300.field_2) {
            operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c0._M_dataplus._M_p != paVar1) {
            operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280._M_dataplus._M_p != &local_280.field_2) {
            operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0._M_dataplus._M_p != paVar2) {
            operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
          }
          if (EVar5 == eSuccess) {
            return 0;
          }
        }
      }
      pcVar9 = "failed to encrypt PDF with new password PDF\n";
      lVar8 = 0x2c;
      goto LAB_0014e7e1;
    }
  }
  pcVar9 = "failed to decrypt PDF\n";
  lVar8 = 0x16;
LAB_0014e7e1:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar9,lVar8);
  return 1;
}

Assistant:

int RecryptPDF(int argc, char* argv[])
{
	EStatusCode status; 

	do
	{
		// recrypt a document with AES encryption, and remove it
		status = PDFWriter::RecryptPDF(
			BuildRelativeInputPath(argv,"china.pdf"),
			"",
			BuildRelativeOutputPath(argv,"chinaWithoutEncryption.pdf"),
			LogConfiguration::DefaultLogConfiguration(),
			PDFCreationSettings(true, true));
		if (status != PDFHummus::eSuccess)
		{
			cout << "failed to decrypt PDF\n";
			break;
		}

		// recrypt an encrypted document with no password
		status = PDFWriter::RecryptPDF(
			BuildRelativeInputPath(argv,"PDFWithPassword.pdf"),
			"user",
			BuildRelativeOutputPath(argv,"RecryptPDFWithPasswordToNothing.pdf"),
			LogConfiguration::DefaultLogConfiguration(),
			PDFCreationSettings(true,true));
		if (status != PDFHummus::eSuccess)
		{
			cout << "failed to decrypt PDF\n";
			break;
		}

		// recrypt an encrypted document with new password
		status = PDFWriter::RecryptPDF(
			BuildRelativeInputPath(argv,"PDFWithPassword.pdf"),
			"user",
			BuildRelativeOutputPath(argv,"RecryptPDFWithPasswordToNewPassword.pdf"),
			LogConfiguration::DefaultLogConfiguration(),
			PDFCreationSettings(true,true,EncryptionOptions("user1",4,"owner1")));
		if (status != PDFHummus::eSuccess)
		{
			cout << "failed to encrypt PDF with new password PDF\n";
			break;
		}

		// recrypt a plain to document to one with password
		status = PDFWriter::RecryptPDF(
			BuildRelativeInputPath(argv,"Original.pdf"),
			"",
			BuildRelativeOutputPath(argv,"RecryptPDFOriginalToPasswordProtected.pdf"),
			LogConfiguration::DefaultLogConfiguration(),
			PDFCreationSettings(true, true, EncryptionOptions("user1", 4, "owner1")));
		if (status != PDFHummus::eSuccess)
		{
			cout << "failed to encrypt PDF with new password PDF\n";
			break;
		}

		// same, but forcing AES
		status = PDFWriter::RecryptPDF(
			BuildRelativeInputPath(argv,"Original.pdf"),
			"",
			BuildRelativeOutputPath(argv,"RecryptPDFOriginalToPasswordProtectedAES.pdf"),
			LogConfiguration::DefaultLogConfiguration(),
			PDFCreationSettings(true, true, EncryptionOptions("user1", 4, "owner1")),
			ePDFVersion16);
		if (status != PDFHummus::eSuccess)
		{
			cout << "failed to encrypt PDF with new password PDF\n";
			break;
		}

	}while(false);

	return status == eSuccess ? 0:1;	
}